

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketImpl::sendImpl
          (WebSocketImpl *this,byte opcode,ArrayPtr<const_unsigned_char> message)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<void> *__return_storage_ptr__;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  char *pcVar1;
  long *plVar2;
  Promise<void> *promise;
  Promise<void> *promise_00;
  undefined4 *puVar3;
  byte *pbVar4;
  long *plVar5;
  byte bVar6;
  uint uVar7;
  PromiseArenaMember *pPVar8;
  undefined8 uVar9;
  ulong uVar10;
  SourceLocation location;
  bool bVar11;
  coroutine_handle<void> coroutine;
  undefined8 *puVar12;
  Exception *__dest;
  undefined1 *__src;
  long lVar13;
  size_t capacity;
  undefined7 in_register_00000031;
  undefined8 in_R8;
  Mask mask;
  undefined8 in_R9;
  long lVar14;
  int iVar16;
  ArrayPtr<const_unsigned_char> AVar17;
  DebugExpression<bool> _kjCondition;
  Fault f;
  undefined8 local_b0;
  Maybe<unsigned_long> local_40;
  Exception *pEVar15;
  
  lVar13 = CONCAT71(in_register_00000031,opcode);
  coroutine._M_fr_ptr = operator_new(0x668);
  *(code **)coroutine._M_fr_ptr = sendImpl;
  *(code **)((long)coroutine._M_fr_ptr + 8) = sendImpl;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x658) = in_R8;
  *(size_t *)((long)coroutine._M_fr_ptr + 0x650) = message.size_;
  *(char *)((long)coroutine._M_fr_ptr + 0x667) = (char)message.ptr;
  *(long *)((long)coroutine._M_fr_ptr + 0x648) = lVar13;
  f.exception = (Exception *)anon_var_dwarf_7c5eb8;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  location.function = "sendImpl";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xdae;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_WebSocket)._vptr_WebSocket = (_func_int **)this_00;
  _kjCondition.value = (bool)(*(byte *)(lVar13 + 0x161) ^ 1);
  if (*(byte *)(lVar13 + 0x161) != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xdaf,FAILED,"!disconnected",
               "_kjCondition,\"WebSocket can\'t send after disconnect()\"",&_kjCondition,
               (char (*) [40])"WebSocket can\'t send after disconnect()");
    kj::_::Debug::Fault::fatal(&f);
  }
  _kjCondition.value = (bool)(*(byte *)(lVar13 + 0x162) ^ 1);
  if (*(byte *)(lVar13 + 0x162) != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[44]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xdb0,FAILED,"!currentlySending",
               "_kjCondition,\"another message send is already in progress\"",&_kjCondition,
               (char (*) [44])"another message send is already in progress");
    kj::_::Debug::Fault::fatal(&f);
  }
  __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
  __return_storage_ptr___00 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x410);
  pcVar1 = (char *)((long)coroutine._M_fr_ptr + 0x5f0);
  plVar2 = (long *)((long)coroutine._M_fr_ptr + 0x610);
  promise = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x638);
  promise_00 = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x640);
  puVar3 = (undefined4 *)((long)coroutine._M_fr_ptr + 0x660);
  *(undefined1 *)(lVar13 + 0x162) = 1;
  do {
    lVar13 = *(long *)((long)coroutine._M_fr_ptr + 0x648);
    puVar12 = (undefined8 *)(lVar13 + 0x350);
    if (*(char *)(lVar13 + 0x348) == '\0') {
      puVar12 = (undefined8 *)0x0;
    }
    iVar16 = 10;
    if (*(char *)(lVar13 + 0x348) == '\x01') {
      bVar6 = *(byte *)(lVar13 + 0x161);
      ((DebugExpression<bool> *)((long)coroutine._M_fr_ptr + 0x666))->value = (bool)(bVar6 ^ 1);
      if (bVar6 != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xdb7,FAILED,"!disconnected",
                   "_kjCondition,\"WebSocket can\'t send after disconnect()\"",
                   (DebugExpression<bool> *)((long)coroutine._M_fr_ptr + 0x666),
                   (char (*) [40])"WebSocket can\'t send after disconnect()");
        kj::_::Debug::Fault::fatal(&f);
      }
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x638) = *puVar12;
      *puVar12 = 0;
      lVar13 = *(long *)((long)coroutine._M_fr_ptr + 0x648);
      *(undefined1 *)(lVar13 + 0x348) = 0;
      pPVar8 = *(PromiseArenaMember **)(lVar13 + 0x350);
      if (pPVar8 != (PromiseArenaMember *)0x0) {
        *(undefined8 *)(*(long *)((long)coroutine._M_fr_ptr + 0x648) + 0x350) = 0;
        kj::_::PromiseDisposer::dispose(pPVar8);
      }
      co_await<void>(__return_storage_ptr__,promise);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x664) = 0;
      bVar11 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                         ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar11) {
        return (Promise<void>)this;
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
      pPVar8 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
      iVar16 = 0;
      if (pPVar8 != (PromiseArenaMember *)0x0) {
        (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(pPVar8);
      }
    }
    mask.maskBytes = SUB84(in_R9,0);
  } while (iVar16 == 0);
  if (iVar16 == 10) {
    lVar13 = *(long *)((long)coroutine._M_fr_ptr + 0x648);
    pbVar4 = (byte *)(lVar13 + 0x160);
    *pbVar4 = *pbVar4 | *(char *)((long)coroutine._M_fr_ptr + 0x667) == '\b';
    puVar12 = *(undefined8 **)(lVar13 + 0x20);
    if (puVar12 == (undefined8 *)0x0) {
      *puVar3 = 0;
    }
    else {
      (**(code **)*puVar12)(puVar12,puVar3,4);
    }
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f0) = 0;
    if (((byte)(*(char *)((long)coroutine._M_fr_ptr + 0x667) - 1U) < 2) &&
       (lVar13 = *(long *)((long)coroutine._M_fr_ptr + 0x648), *(char *)(lVar13 + 0x28) == '\x01'))
    {
      if (*(char *)(lVar13 + 0x60) == '\0') {
        f.exception = (Exception *)0x0;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x628) = 0;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x630) = 0;
        kj::_::Debug::Fault::init
                  (&f,(EVP_PKEY_CTX *)
                      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                  );
        kj::_::Debug::Fault::fatal(&f);
      }
      if (*(char *)(lVar13 + 0x30) == '\x01') {
        ZlibContext::reset((ZlibContext *)(lVar13 + 0x68));
      }
      local_40.ptr.isSet = false;
      mask.maskBytes[0] = '\0';
      mask.maskBytes[1] = '\0';
      mask.maskBytes[2] = '\0';
      mask.maskBytes[3] = '\0';
      ZlibContext::processMessage
                ((OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)&f,
                 (ZlibContext *)(lVar13 + 0x68),
                 *(ArrayPtr<const_unsigned_char> *)((long)coroutine._M_fr_ptr + 0x650),&local_40,
                 false);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5c8) = 1;
      *(int *)((long)coroutine._M_fr_ptr + 0x5d0) = (int)f.exception;
      if ((int)f.exception == 2) {
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e8) = local_b0;
        *(char **)((long)coroutine._M_fr_ptr + 0x5d8) = "sendImpl";
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e0) = 0x1500000dae;
      }
      else if ((int)f.exception == 1) {
        *(char **)((long)coroutine._M_fr_ptr + 0x5d8) = "sendImpl";
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e0) = 0x1500000dae;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e8) = local_b0;
      }
      OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::destroy
                ((OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)&f);
      uVar7 = ((OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)
              ((long)coroutine._M_fr_ptr + 0x5d0))->tag;
      if (uVar7 == 1) {
        if (*(char *)((long)coroutine._M_fr_ptr + 0x5f0) == '\x01') {
          *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f0) = 0;
          lVar13 = *(long *)((long)coroutine._M_fr_ptr + 0x5f8);
          if (lVar13 != 0) {
            *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5f8) = 0;
            *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600) = 0;
            mask.maskBytes[0] = '\0';
            mask.maskBytes[1] = '\0';
            mask.maskBytes[2] = '\0';
            mask.maskBytes[3] = '\0';
            (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x608))
                      (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x608),lVar13,1);
          }
        }
        __src = *(undefined1 **)((long)coroutine._M_fr_ptr + 0x5d8);
        uVar10 = *(ulong *)((long)coroutine._M_fr_ptr + 0x5e0);
        *(undefined1 **)((long)coroutine._M_fr_ptr + 0x5f8) = __src;
        *(ulong *)((long)coroutine._M_fr_ptr + 0x600) = uVar10;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x608) =
             *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e8);
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5d8) = 0;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e0) = 0;
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f0) = 1;
        if (*(long *)((long)coroutine._M_fr_ptr + 0x658) == 0) {
          __src = (undefined1 *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (1,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
          *__src = 0;
          if (*pcVar1 == '\x01') {
            *pcVar1 = '\0';
            lVar13 = *(long *)((long)coroutine._M_fr_ptr + 0x5f8);
            if (lVar13 != 0) {
              *(long *)((long)coroutine._M_fr_ptr + 0x5f8) = 0;
              *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600) = 0;
              mask.maskBytes[0] = '\0';
              mask.maskBytes[1] = '\0';
              mask.maskBytes[2] = '\0';
              mask.maskBytes[3] = '\0';
              (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x608))
                        (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x608),lVar13,1);
            }
          }
          *(undefined1 **)((long)coroutine._M_fr_ptr + 0x5f8) = __src;
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600) = 1;
          *(undefined8 **)((long)coroutine._M_fr_ptr + 0x608) = &kj::_::HeapArrayDisposer::instance;
          *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f0) = 1;
          capacity = 1;
        }
        else {
          f.exception._0_4_ = 0xffff0000;
          if (uVar10 < 4) {
            _kjCondition.value = false;
LAB_003b111f:
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                       ,0xdde,FAILED,"innerMessage.asPtr().endsWith({0x00, 0x00, 0xFF, 0xFF})",
                       "_kjCondition,",&_kjCondition);
            kj::_::Debug::Fault::fatal(&f);
          }
          _kjCondition.value = *(int *)(__src + (uVar10 - 4)) == -0x10000;
          if (!_kjCondition.value) goto LAB_003b111f;
          capacity = uVar10 - 4;
        }
      }
      else {
        if (uVar7 == 2) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38],kj::StringPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0xdd9,FAILED,(char *)0x0,
                     "\"Error compressing websocket message: \", error.description",
                     (char (*) [38])"Error compressing websocket message: ",
                     (StringPtr *)((long)coroutine._M_fr_ptr + 0x5e0));
          kj::_::Debug::Fault::fatal(&f);
        }
        __src = *(undefined1 **)((long)coroutine._M_fr_ptr + 0x650);
        capacity = *(size_t *)((long)coroutine._M_fr_ptr + 0x658);
      }
      bVar11 = true;
      if (*(char *)((long)coroutine._M_fr_ptr + 0x5c8) == '\x01') {
        OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::destroy
                  ((OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)
                   ((long)coroutine._M_fr_ptr + 0x5d0));
      }
    }
    else {
      __src = *(undefined1 **)((long)coroutine._M_fr_ptr + 0x650);
      capacity = *(size_t *)((long)coroutine._M_fr_ptr + 0x658);
      bVar11 = false;
    }
    *plVar2 = 0;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x618) = 0;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x620) = 0;
    if (((*(char *)((long)coroutine._M_fr_ptr + 0x661) != '\0' ||
         *(char *)((long)coroutine._M_fr_ptr + 0x660) != '\0') ||
        *(char *)((long)coroutine._M_fr_ptr + 0x662) != '\0') ||
        *(char *)((long)coroutine._M_fr_ptr + 0x663) != '\0') {
      __dest = (Exception *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (1,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      pEVar15 = __dest;
      if (capacity != 0) {
        pEVar15 = (Exception *)((long)__dest->trace + (capacity - 0x68));
        memcpy(__dest,__src,capacity);
      }
      lVar14 = (long)pEVar15 - (long)__dest;
      lVar13 = *plVar2;
      f.exception = __dest;
      if (lVar13 != 0) {
        uVar9 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x618);
        *plVar2 = 0;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x618) = 0;
        mask.maskBytes[0] = '\0';
        mask.maskBytes[1] = '\0';
        mask.maskBytes[2] = '\0';
        mask.maskBytes[3] = '\0';
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x620))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x620),lVar13,1,uVar9,uVar9);
      }
      *(Exception **)((long)coroutine._M_fr_ptr + 0x610) = f.exception;
      *(long *)((long)coroutine._M_fr_ptr + 0x618) = lVar14;
      *(undefined8 **)((long)coroutine._M_fr_ptr + 0x620) = &kj::_::HeapArrayDisposer::instance;
      if (lVar14 != 0) {
        lVar13 = 0;
        do {
          pbVar4 = (byte *)((long)(f.exception)->trace + lVar13 + -0x68);
          *pbVar4 = *pbVar4 ^ *(byte *)((long)puVar3 + (ulong)((uint)lVar13 & 3));
          lVar13 = lVar13 + 1;
        } while (lVar14 != lVar13);
      }
      __src = *(undefined1 **)((long)coroutine._M_fr_ptr + 0x610);
      capacity = *(size_t *)((long)coroutine._M_fr_ptr + 0x618);
    }
    lVar13 = *(long *)((long)coroutine._M_fr_ptr + 0x648);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x400) = 0;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x408) = 0;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x3f0) = 0;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x3f8) = 0;
    AVar17 = Header::compose((Header *)(lVar13 + 0x163),bVar11,
                             *(bool *)((long)coroutine._M_fr_ptr + 0x667),(byte)capacity,
                             (ulong)*(uint *)((long)coroutine._M_fr_ptr + 0x660),mask);
    *(ArrayPtr<const_unsigned_char> *)((long)coroutine._M_fr_ptr + 0x3f0) = AVar17;
    *(undefined1 **)((long)coroutine._M_fr_ptr + 0x400) = __src;
    *(size_t *)((long)coroutine._M_fr_ptr + 0x408) = capacity;
    _kjCondition.value = (*(byte *)(lVar13 + 0x163) & 0x30) == 0;
    if (!_kjCondition.value) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[98]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xdf9,FAILED,"!sendHeader.hasRsv2or3()",
                 "_kjCondition,\"RSV bits 2 and 3 must be 0, as we do not currently \" \"support an extension that would set these bits\""
                 ,&_kjCondition,
                 (char (*) [98])
                 "RSV bits 2 and 3 must be 0, as we do not currently support an extension that would set these bits"
                );
      kj::_::Debug::Fault::fatal(&f);
    }
    lVar13 = *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x648) + 0x18);
    (**(code **)(*(long *)(lVar13 + 8) + 8))
              (promise_00,lVar13 + 8,(undefined8 *)((long)coroutine._M_fr_ptr + 0x3f0),2);
    co_await<void>(__return_storage_ptr___00,promise_00);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x664) = 1;
    bVar11 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                       ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
    if (!bVar11) {
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x428) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x430));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase
                ((PromiseAwaiterBase *)__return_storage_ptr___00);
      pPVar8 = &((promise_00->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
      if (pPVar8 != (PromiseArenaMember *)0x0) {
        (promise_00->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(pPVar8);
      }
      lVar13 = *(long *)((long)coroutine._M_fr_ptr + 0x648);
      *(undefined1 *)(lVar13 + 0x162) = 0;
      if (*(char *)(lVar13 + 0x310) == '\x01') {
        setUpSendingControlMessage(*(WebSocketImpl **)((long)coroutine._M_fr_ptr + 0x648));
      }
      plVar5 = (long *)(*(long *)((long)coroutine._M_fr_ptr + 0x648) + 0x3a8);
      *plVar5 = *plVar5 + *(long *)((long)coroutine._M_fr_ptr + 0x408) +
                          *(long *)((long)coroutine._M_fr_ptr + 0x3f8);
      lVar13 = *(long *)((long)coroutine._M_fr_ptr + 0x610);
      if (lVar13 != 0) {
        uVar9 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x618);
        *plVar2 = 0;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x618) = 0;
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x620))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x620),lVar13,1,uVar9,uVar9,0);
      }
      if ((*pcVar1 == '\x01') &&
         (lVar13 = *(long *)((long)coroutine._M_fr_ptr + 0x5f8), lVar13 != 0)) {
        uVar9 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600);
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5f8) = 0;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600) = 0;
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x608))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x608),lVar13,1,uVar9,uVar9,0);
      }
      kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x665));
      *(undefined8 *)coroutine._M_fr_ptr = 0;
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x664) = 2;
    }
  }
  else {
    if ((((ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98))->exception).ptr.isSet == true) {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
    }
    kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
    operator_delete(coroutine._M_fr_ptr,0x668);
  }
  return (Promise<void>)this;
}

Assistant:

kj::Promise<void> sendImpl(byte opcode, kj::ArrayPtr<const byte> message) {
    KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");
    KJ_REQUIRE(!currentlySending, "another message send is already in progress");

    currentlySending = true;

    for (;;) {
      KJ_IF_SOME(p, sendingControlMessage) {
        // Re-check in case of disconnect on a previous loop iteration.
        KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");

        // We recently sent a control message; make sure it's finished before proceeding.
        auto localPromise = kj::mv(p);
        sendingControlMessage = kj::none;
        co_await localPromise;
      } else {
        break;
      }
    }